

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O3

bool __thiscall
tinyusdz::GeomPrimvar::
get_value<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
          (GeomPrimvar *this,
          vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *dest,
          string *err)

{
  Attribute *this_00;
  pointer *ppaVar1;
  vtable_type *pvVar2;
  byte bVar3;
  bool bVar4;
  uint32_t uVar5;
  pointer pSVar6;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *__x;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  undefined7 uVar8;
  uint uVar9;
  pointer pSVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  bool local_b8 [8];
  undefined1 local_b0 [24];
  string local_98;
  pointer *local_78;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> local_70;
  undefined1 local_54 [20];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (dest == (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)0x0) {
joined_r0x0048f9b1:
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
  }
  else {
    if ((this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar2 = (this->_attr)._var._value.v_.vtable;
      if (pvVar2 == (vtable_type *)0x0) {
        bVar4 = false;
        uVar8 = 0;
      }
      else {
        uVar5 = (*pvVar2->type_id)();
        bVar4 = uVar5 == 4;
        uVar8 = (undefined7)((ulong)in_RCX >> 8);
      }
      bVar3 = (this->_attr)._var._blocked;
      in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(uVar8,bVar4 | bVar3);
      if (bVar4 != false || (bVar3 & 1) != 0) goto joined_r0x0048f9b1;
    }
    else {
      bVar3 = (this->_attr)._var._blocked;
    }
    if ((((bVar3 & 1) == 0) &&
        (pvVar2 = (this->_attr)._var._value.v_.vtable, pvVar2 != (vtable_type *)0x0)) &&
       ((uVar5 = (*pvVar2->type_id)(), uVar5 == 0 ||
        ((pvVar2 = (this->_attr)._var._value.v_.vtable, pvVar2 != (vtable_type *)0x0 &&
         (uVar5 = (*pvVar2->type_id)(), uVar5 == 1)))))) {
      pSVar10 = (this->_attr)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar6 = (this->_attr)._var._ts._samples.
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pSVar6 != pSVar10) {
        if ((this->_attr)._var._ts._dirty == true) {
          tinyusdz::value::TimeSamples::update(&(this->_attr)._var._ts);
          pSVar10 = (this->_attr)._var._ts._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar6 = (this->_attr)._var._ts._samples.
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        if (pSVar6 != pSVar10) {
          __x = tinyusdz::value::Value::
                as<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                          (&pSVar10->value,false);
          if (__x == (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                     0x0) {
            return false;
          }
          ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
          operator=(dest,__x);
          return true;
        }
        ::std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
      }
    }
    else {
      this_00 = &this->_attr;
      uVar5 = Attribute::type_id(this_00);
      bVar4 = IsSupportedGeomPrimvarType(uVar5);
      if (bVar4) {
        primvar::PrimVar::
        get_value<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                  ((optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                    *)local_b8,&(this->_attr)._var);
        bVar4 = local_b8[0];
        uVar9 = (uint)local_b8[0];
        if (local_b8[0] == true) {
          local_70.
          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_b0._0_8_;
          local_70.
          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)local_b0._8_8_;
          local_70.
          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_b0._16_8_;
          local_78 = (pointer *)CONCAT71(local_78._1_7_,1);
          ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
          operator=(dest,&local_70);
          uVar7 = (ulong)local_78 & 0xff;
        }
        else {
          local_78 = (pointer *)CONCAT71(local_78._1_7_,local_b8[0]);
          uVar7 = (ulong)uVar9;
          if (err != (string *)0x0) {
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_98,
                       "Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`"
                       ,"");
            local_54._0_4_ = 0x10002d;
            Attribute::type_name_abi_cxx11_((string *)(local_54 + 4),this_00);
            fmt::format<unsigned_int,std::__cxx11::string>
                      ((string *)local_b8,(fmt *)&local_98,(string *)local_54,(uint *)(local_54 + 4)
                       ,in_R8);
            ::std::__cxx11::string::_M_append((char *)err,CONCAT71(local_b8._1_7_,local_b8[0]));
            if ((undefined1 *)CONCAT71(local_b8._1_7_,local_b8[0]) != local_b0 + 8) {
              operator_delete((undefined1 *)CONCAT71(local_b8._1_7_,local_b8[0]),local_b0._8_8_ + 1)
              ;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_54._4_8_ != &local_40) {
              operator_delete((void *)local_54._4_8_,local_40._0_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            uVar7 = (ulong)uVar9;
          }
        }
        if ((uVar7 & 1) == 0) {
          return bVar4;
        }
        if ((anon_struct_8_0_00000001_for___align)
            local_70.
            super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
            _M_impl.super__Vector_impl_data._M_start == (anon_struct_8_0_00000001_for___align)0x0) {
          return bVar4;
        }
        operator_delete(local_70.
                        super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_70.
                              super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.
                              super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        return bVar4;
      }
      if (err != (string *)0x0) {
        ppaVar1 = &local_70.
                   super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        local_78 = ppaVar1;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"Unsupported type for GeomPrimvar. type = `{}`","");
        Attribute::type_name_abi_cxx11_(&local_98,this_00);
        fmt::format<std::__cxx11::string>
                  ((string *)local_b8,(fmt *)&local_78,(string *)&local_98,in_RCX);
        ::std::__cxx11::string::_M_append((char *)err,CONCAT71(local_b8._1_7_,local_b8[0]));
        if ((undefined1 *)CONCAT71(local_b8._1_7_,local_b8[0]) != local_b0 + 8) {
          operator_delete((undefined1 *)CONCAT71(local_b8._1_7_,local_b8[0]),local_b0._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if (local_78 != ppaVar1) {
          operator_delete(local_78,(ulong)((long)(local_70.
                                                  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                                 _M_elems + 1));
        }
      }
    }
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(T *dest, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (_attr.has_value()) {
    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    if (auto pv = _attr.get_value<T>()) {

      // copy
      (*dest) = pv.value();
      return true;

    } else {
      if (err) {
        (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }
  }

  if (_attr.has_timesamples()) {
    // Return the first sample.
    const auto &ts = _attr.get_var().ts_raw();
    if (ts.empty()) {
      if (err) {
        (*err) += "No TimeSample value in Attribute..";
      }
      return false;
    }
    
    if (auto pv =ts.get_samples().at(0).value.as<T>()) {
      (*dest) = (*pv);
      return true;
    }
  }

  return false;
}